

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

WalkResult __thiscall Map::Walk(Map *this,Character *from,Direction direction,bool admin)

{
  list<Character_*,_std::allocator<Character_*>_> *plVar1;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *plVar2;
  short id;
  World *pWVar3;
  pointer ppNVar4;
  Character *pCVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  NPC *pNVar7;
  undefined8 uVar8;
  pointer psVar9;
  _Alloc_hider _Var10;
  byte bVar11;
  bool bVar12;
  int iVar13;
  WalkResult WVar14;
  mapped_type *pmVar15;
  Map_Tile *pMVar16;
  Map *pMVar17;
  _List_node_base *p_Var18;
  Character ***pppCVar19;
  long *plVar20;
  byte bVar21;
  Character **ppCVar22;
  pointer psVar23;
  undefined8 uVar24;
  Character **ppCVar25;
  byte bVar26;
  iterator __position;
  undefined8 uVar27;
  vector<Character*,std::allocator<Character*>> *this_01;
  vector<NPC*,std::allocator<NPC*>> *this_02;
  byte y;
  int i;
  byte x;
  ulong uVar28;
  pointer ppNVar29;
  undefined8 uVar30;
  bool bVar31;
  double dVar32;
  PacketBuilder builder;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> oldcoords;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> newcoords;
  vector<NPC_*,_std::allocator<NPC_*>_> oldnpcs;
  vector<NPC_*,_std::allocator<NPC_*>_> newnpcs;
  vector<Character_*,_std::allocator<Character_*>_> oldchars;
  vector<Character_*,_std::allocator<Character_*>_> newchars;
  PacketBuilder rbuilder;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> newitems;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [104];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  undefined1 local_138 [16];
  Character **local_128;
  Character **local_118;
  Character **ppCStack_110;
  Character **local_108;
  uint local_100;
  uint local_fc;
  undefined1 local_f8 [48];
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> local_c8;
  _Alloc_hider local_a8;
  string local_a0;
  Arena *local_80;
  double local_78;
  key_type local_70;
  undefined1 local_50 [32];
  
  pWVar3 = this->world;
  local_1f0._0_8_ = (Character *)local_1e0;
  local_1e0._32_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"SeeDistance","");
  pmVar15 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar3->config,(key_type *)local_1f0);
  util::variant::GetInt(pmVar15);
  if ((Character *)local_1f0._0_8_ != (Character *)local_1e0) {
    operator_delete((void *)local_1f0._0_8_,local_1e0._0_8_ + 1);
  }
  uVar27 = local_1e0._32_8_;
  x = from->x;
  y = from->y;
  local_a8._M_p = (pointer)(ulong)direction;
  bVar21 = y;
  switch(local_a8._M_p) {
  case (pointer)0x0:
    y = y + 1;
    goto switchD_0017221e_default;
  case (pointer)0x1:
    bVar11 = x - 1;
    bVar26 = x;
    break;
  case (pointer)0x2:
    bVar21 = y - 1;
    bVar11 = x;
    bVar26 = y;
    break;
  case (pointer)0x3:
    bVar11 = x + 1;
    bVar26 = x + 1;
    break;
  default:
    goto switchD_0017221e_default;
  }
  x = bVar11;
  y = bVar21;
  if (bVar26 == 0) {
    return WalkFail;
  }
switchD_0017221e_default:
  if (*(uchar *)(local_1e0._32_8_ + 0x18) <= x) {
    return WalkFail;
  }
  if (*(uchar *)(local_1e0._32_8_ + 0x19) <= y) {
    return WalkFail;
  }
  pMVar17 = (Map *)local_1e0._32_8_;
  bVar21 = y;
  bVar26 = x;
  if (!admin) {
    local_fc = (uint)x;
    local_100 = (uint)y;
    bVar12 = Walkable((Map *)local_1e0._32_8_,x,y,false);
    if (!bVar12) {
      return WalkFail;
    }
    bVar12 = false;
    if ((x < *(uchar *)(uVar27 + 0x18)) && (y < *(uchar *)(uVar27 + 0x19))) {
      for (p_Var18 = (((list<Character_*,_std::allocator<Character_*>_> *)(local_1e0._32_8_ + 0x20))
                     ->super__List_base<Character_*,_std::allocator<Character_*>_>)._M_impl._M_node.
                     super__List_node_base._M_next;
          bVar31 = p_Var18 != (_List_node_base *)(local_1e0._32_8_ + 0x20), bVar31;
          p_Var18 = p_Var18->_M_next) {
        if ((*(byte *)&p_Var18[1]._M_next[0xc]._M_next == x) &&
           (*(byte *)((long)&p_Var18[1]._M_next[0xc]._M_next + 1) == y)) {
          bVar12 = true;
          if (bVar31) goto LAB_0017328f;
          break;
        }
      }
      bVar12 = false;
    }
LAB_0017328f:
    if (bVar12) {
      local_78 = from->last_walk;
      pWVar3 = *(World **)local_1e0._32_8_;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"GhostTimer","");
      pmVar15 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar3->config,&local_70);
      local_80 = (Arena *)util::variant::GetFloat(pmVar15);
      dVar32 = Timer::GetTime();
      pMVar17 = (Map *)local_1e0._32_8_;
      bVar12 = dVar32 < local_78 + (double)local_80;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar12 = false;
      pMVar17 = (Map *)local_1e0._32_8_;
    }
    bVar26 = (byte)local_fc;
    bVar21 = (byte)local_100;
    if (bVar12) {
      return WalkFail;
    }
  }
  pMVar16 = GetTile(pMVar17,bVar26,bVar21);
  id = (pMVar16->warp).map;
  if (id != 0) {
    if (((pMVar16->warp).levelreq <= from->level) &&
       (((pMVar16->warp).spec == NoDoor || ((pMVar16->warp).open == true)))) {
      pMVar17 = World::GetMap(pMVar17->world,id);
      iVar13 = (**(from->super_Command_Source)._vptr_Command_Source)(from);
      if (((char)iVar13 == '\0') &&
         ((pMVar17->evacuate_lock == true && (pMVar17->id != from->map->id)))) {
        pWVar3 = *(World **)local_1e0._32_8_;
        local_1f0._0_8_ = local_1e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"map_evacuate_block","")
        ;
        I18N::Format<>((string *)local_50,&pWVar3->i18n,(string *)local_1f0);
        (*(from->super_Command_Source)._vptr_Command_Source[6])(from,local_50);
        if ((Character *)local_50._0_8_ != (Character *)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_,(ulong)(local_50._16_8_ + 1));
        }
        if ((undefined1 *)local_1f0._0_8_ != local_1e0) {
          operator_delete((void *)local_1f0._0_8_,local_1e0._0_8_ + 1);
        }
        Character::Refresh(from);
      }
      else {
        Character::Warp(from,(pMVar16->warp).map,(pMVar16->warp).x,(pMVar16->warp).y,
                        WARP_ANIMATION_NONE);
      }
      return WalkWarped;
    }
    if (!admin) {
      return WalkFail;
    }
  }
  dVar32 = Timer::GetTime();
  from->last_walk = dVar32;
  from->attacks = 0;
  Character::CancelSpell(from);
  from->direction = direction;
  from->x = x;
  from->y = y;
  local_1e0._88_8_ = (pointer)0x0;
  local_1e0._72_8_ = (void *)0x0;
  local_1e0._80_8_ = 0;
  local_1e0._56_8_ = (pointer)0x0;
  local_1e0._40_8_ = (void *)0x0;
  local_1e0._48_8_ = (void *)0x0;
  local_108 = (Character **)0x0;
  local_118 = (Character **)0x0;
  ppCStack_110 = (Character **)0x0;
  local_128 = (Character **)0x0;
  local_138._0_8_ = (Character **)0x0;
  local_138._8_8_ = (Character **)0x0;
  local_148._M_p = (pointer)0x0;
  local_158._M_allocated_capacity = 0;
  local_158._8_8_ = (NPC **)0x0;
  local_168._M_p = (pointer)0x0;
  local_178._M_allocated_capacity = 0;
  local_178._8_8_ = (NPC **)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  if (direction < 4) {
    WVar14 = (*(code *)(&DAT_001a8718 + *(int *)(&DAT_001a8718 + (long)local_a8._M_p * 4)))();
    return WVar14;
  }
  plVar1 = (list<Character_*,_std::allocator<Character_*>_> *)(local_1e0._32_8_ + 0x20);
  p_Var18 = (((list<Character_*,_std::allocator<Character_*>_> *)(local_1e0._32_8_ + 0x20))->
            super__List_base<Character_*,_std::allocator<Character_*>_>)._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var18 != (_List_node_base *)plVar1) {
    do {
      local_1f0._0_8_ = p_Var18[1]._M_next;
      if (((Character *)local_1f0._0_8_ != from) && (local_1e0._48_8_ != local_1e0._40_8_)) {
        uVar28 = 0;
        do {
          if ((*(uint *)(local_1e0._40_8_ + uVar28 * 8) ==
               (uint)*(byte *)&((_List_node_base *)(local_1f0._0_8_ + 0xc0))->_M_next) &&
             (*(uint *)(local_1e0._40_8_ + 4 + uVar28 * 8) ==
              (uint)*(uchar *)(local_1f0._0_8_ + 0xc1))) {
            pppCVar19 = (Character ***)(local_1e0 + 0xb0);
            __position._M_current = (Character **)local_138._8_8_;
            ppCVar22 = (Character **)local_138._8_8_;
            this_01 = (vector<Character*,std::allocator<Character*>> *)(local_1e0 + 0xa8);
            if ((Character **)local_138._8_8_ == local_128) {
LAB_00172776:
              std::vector<Character*,std::allocator<Character*>>::
              _M_realloc_insert<Character*const&>(this_01,__position,(Character **)local_1f0);
            }
            else {
LAB_0017273c:
              *ppCVar22 = (Character *)local_1f0._0_8_;
              *pppCVar19 = *pppCVar19 + 1;
            }
          }
          else if ((*(uint *)(local_1e0._72_8_ + uVar28 * 8) ==
                    (uint)*(byte *)&((_List_node_base *)(local_1f0._0_8_ + 0xc0))->_M_next) &&
                  (*(uint *)(local_1e0._72_8_ + 4 + uVar28 * 8) ==
                   (uint)*(uchar *)(local_1f0._0_8_ + 0xc1))) {
            pppCVar19 = &ppCStack_110;
            __position._M_current = ppCStack_110;
            ppCVar22 = ppCStack_110;
            this_01 = (vector<Character*,std::allocator<Character*>> *)&local_118;
            if (ppCStack_110 == local_108) goto LAB_00172776;
            goto LAB_0017273c;
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 < (ulong)((long)(local_1e0._48_8_ - local_1e0._40_8_) >> 3));
      }
      p_Var18 = p_Var18->_M_next;
    } while (p_Var18 != (_List_node_base *)plVar1);
  }
  ppNVar29 = (((vector<NPC_*,_std::allocator<NPC_*>_> *)(local_1e0._32_8_ + 0x38))->
             super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.super__Vector_impl_data.
             _M_start;
  ppNVar4 = (((vector<NPC_*,_std::allocator<NPC_*>_> *)(local_1e0._32_8_ + 0x38))->
            super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  if (ppNVar29 != ppNVar4) {
    do {
      local_1f0._0_8_ = *ppNVar29;
      if ((*(bool *)&((Character *)local_1f0._0_8_)->id == true) &&
         (local_1e0._48_8_ != local_1e0._40_8_)) {
        uVar28 = 0;
        do {
          if ((*(uint *)(local_1e0._40_8_ + uVar28 * 8) == (uint)*(uchar *)(local_1f0._0_8_ + 2)) &&
             (*(uint *)(local_1e0._40_8_ + 4 + uVar28 * 8) == (uint)*(uchar *)(local_1f0._0_8_ + 3))
             ) {
            plVar20 = (long *)(local_1e0 + 0x70);
            uVar27 = local_178._8_8_;
            this_02 = (vector<NPC*,std::allocator<NPC*>> *)(local_1e0 + 0x68);
            if ((pointer)local_178._8_8_ == local_168._M_p) {
LAB_0017286c:
              std::vector<NPC*,std::allocator<NPC*>>::_M_realloc_insert<NPC*const&>
                        (this_02,(iterator)uVar27,(NPC **)local_1f0);
            }
            else {
LAB_00172830:
              *(undefined8 *)uVar27 = local_1f0._0_8_;
              *plVar20 = *plVar20 + 8;
            }
          }
          else if ((*(uint *)(local_1e0._72_8_ + uVar28 * 8) ==
                    (uint)*(uchar *)(local_1f0._0_8_ + 2)) &&
                  (*(uint *)(local_1e0._72_8_ + 4 + uVar28 * 8) ==
                   (uint)*(uchar *)(local_1f0._0_8_ + 3))) {
            plVar20 = (long *)(local_1e0 + 0x90);
            uVar27 = local_158._8_8_;
            this_02 = (vector<NPC*,std::allocator<NPC*>> *)(local_1e0 + 0x88);
            if ((pointer)local_158._8_8_ == local_148._M_p) goto LAB_0017286c;
            goto LAB_00172830;
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 < (ulong)((long)(local_1e0._48_8_ - local_1e0._40_8_) >> 3));
      }
      ppNVar29 = ppNVar29 + 1;
    } while (ppNVar29 != ppNVar4);
  }
  plVar2 = (list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
           (local_1e0._32_8_ + 0x68);
  p_Var18 = (((list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
             (local_1e0._32_8_ + 0x68))->
            super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var18 != (_List_node_base *)plVar2) {
    do {
      local_1f0._0_8_ = p_Var18[1]._M_next;
      local_1f0._8_8_ = p_Var18[1]._M_prev;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_)->_M_use_count + 1;
        }
      }
      if (local_1e0._48_8_ != local_1e0._40_8_) {
        uVar28 = 0;
        do {
          if ((*(uint *)(local_1e0._72_8_ + uVar28 * 8) == (uint)*(byte *)(local_1f0._0_8_ + 8)) &&
             (*(uint *)(local_1e0._72_8_ + 4 + uVar28 * 8) == (uint)*(byte *)(local_1f0._0_8_ + 9)))
          {
            std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
            push_back(&local_c8,(value_type *)local_1f0);
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 < (ulong)((long)(local_1e0._48_8_ - local_1e0._40_8_) >> 3));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_);
      }
      p_Var18 = p_Var18->_M_next;
    } while (p_Var18 != (_List_node_base *)plVar2);
  }
  PacketBuilder::PacketBuilder((PacketBuilder *)local_1f0,PACKET_AVATAR,PACKET_REMOVE,2);
  iVar13 = Character::PlayerID(from);
  PacketBuilder::AddShort((PacketBuilder *)local_1f0,iVar13);
  uVar27 = local_138._8_8_;
  if (local_138._0_8_ != local_138._8_8_) {
    ppCVar22 = (Character **)local_138._0_8_;
    do {
      pCVar5 = *ppCVar22;
      PacketBuilder::PacketBuilder((PacketBuilder *)local_f8,PACKET_AVATAR,PACKET_REMOVE,2);
      iVar13 = Character::PlayerID(pCVar5);
      PacketBuilder::AddShort((PacketBuilder *)local_f8,iVar13);
      Character::Send(pCVar5,(PacketBuilder *)local_1f0);
      Character::Send(from,(PacketBuilder *)local_f8);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_f8);
      ppCVar22 = ppCVar22 + 1;
    } while (ppCVar22 != (Character **)uVar27);
  }
  PacketBuilder::Reset((PacketBuilder *)local_1f0,0x3e);
  PacketBuilder::SetID((PacketBuilder *)local_1f0,PACKET_PLAYERS,PACKET_AGREE);
  PacketBuilder::AddByte((PacketBuilder *)local_1f0,0xff);
  (*(from->super_Command_Source)._vptr_Command_Source[2])(local_f8,from);
  PacketBuilder::AddBreakString((PacketBuilder *)local_1f0,(string *)local_f8,0xff);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  iVar13 = Character::PlayerID(from);
  PacketBuilder::AddShort((PacketBuilder *)local_1f0,iVar13);
  PacketBuilder::AddShort((PacketBuilder *)local_1f0,(int)from->mapid);
  PacketBuilder::AddShort((PacketBuilder *)local_1f0,(uint)from->x);
  PacketBuilder::AddShort((PacketBuilder *)local_1f0,(uint)from->y);
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)from->direction);
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,6);
  Character::PaddedGuildTag_abi_cxx11_((string *)local_f8,from);
  PacketBuilder::AddString((PacketBuilder *)local_1f0,(string *)local_f8);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)from->level);
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)from->gender);
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)from->hairstyle);
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)from->haircolor);
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)from->race);
  PacketBuilder::AddShort((PacketBuilder *)local_1f0,from->maxhp);
  PacketBuilder::AddShort((PacketBuilder *)local_1f0,from->hp);
  PacketBuilder::AddShort((PacketBuilder *)local_1f0,from->maxtp);
  PacketBuilder::AddShort((PacketBuilder *)local_1f0,from->tp);
  Character::AddPaperdollData(from,(PacketBuilder *)local_1f0,"B000A0HSW");
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)from->sitting);
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,from->hidden & 1);
  PacketBuilder::AddByte((PacketBuilder *)local_1f0,0xff);
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,1);
  ppCVar22 = ppCStack_110;
  if (local_118 != ppCStack_110) {
    ppCVar25 = local_118;
    do {
      pCVar5 = *ppCVar25;
      PacketBuilder::PacketBuilder((PacketBuilder *)local_f8,PACKET_PLAYERS,PACKET_AGREE,0x3e);
      PacketBuilder::AddByte((PacketBuilder *)local_f8,0xff);
      (*(pCVar5->super_Command_Source)._vptr_Command_Source[2])(&local_a0,pCVar5);
      PacketBuilder::AddBreakString((PacketBuilder *)local_f8,&local_a0,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._0_8_ + 1);
      }
      iVar13 = Character::PlayerID(pCVar5);
      PacketBuilder::AddShort((PacketBuilder *)local_f8,iVar13);
      PacketBuilder::AddShort((PacketBuilder *)local_f8,(int)pCVar5->mapid);
      PacketBuilder::AddShort((PacketBuilder *)local_f8,(uint)pCVar5->x);
      PacketBuilder::AddShort((PacketBuilder *)local_f8,(uint)pCVar5->y);
      PacketBuilder::AddChar((PacketBuilder *)local_f8,(uint)pCVar5->direction);
      PacketBuilder::AddChar((PacketBuilder *)local_f8,6);
      Character::PaddedGuildTag_abi_cxx11_(&local_a0,pCVar5);
      PacketBuilder::AddString((PacketBuilder *)local_f8,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._0_8_ + 1);
      }
      PacketBuilder::AddChar((PacketBuilder *)local_f8,(uint)pCVar5->level);
      PacketBuilder::AddChar((PacketBuilder *)local_f8,(uint)pCVar5->gender);
      PacketBuilder::AddChar((PacketBuilder *)local_f8,(uint)pCVar5->hairstyle);
      PacketBuilder::AddChar((PacketBuilder *)local_f8,(uint)pCVar5->haircolor);
      PacketBuilder::AddChar((PacketBuilder *)local_f8,(uint)pCVar5->race);
      PacketBuilder::AddShort((PacketBuilder *)local_f8,pCVar5->maxhp);
      PacketBuilder::AddShort((PacketBuilder *)local_f8,pCVar5->hp);
      PacketBuilder::AddShort((PacketBuilder *)local_f8,pCVar5->maxtp);
      PacketBuilder::AddShort((PacketBuilder *)local_f8,pCVar5->tp);
      Character::AddPaperdollData(pCVar5,(PacketBuilder *)local_f8,"B000A0HSW");
      PacketBuilder::AddChar((PacketBuilder *)local_f8,(uint)pCVar5->sitting);
      PacketBuilder::AddChar((PacketBuilder *)local_f8,pCVar5->hidden & 1);
      PacketBuilder::AddByte((PacketBuilder *)local_f8,0xff);
      PacketBuilder::AddChar((PacketBuilder *)local_f8,1);
      Character::Send(pCVar5,(PacketBuilder *)local_1f0);
      Character::Send(from,(PacketBuilder *)local_f8);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_f8);
      ppCVar25 = ppCVar25 + 1;
    } while (ppCVar25 != ppCVar22);
  }
  PacketBuilder::Reset((PacketBuilder *)local_1f0,5);
  _Var10._M_p = local_a8._M_p;
  PacketBuilder::SetID((PacketBuilder *)local_1f0,PACKET_WALK,PACKET_PLAYER);
  iVar13 = Character::PlayerID(from);
  PacketBuilder::AddShort((PacketBuilder *)local_1f0,iVar13);
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,(int)_Var10._M_p);
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)from->x);
  PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)from->y);
  p_Var18 = (plVar1->super__List_base<Character_*,_std::allocator<Character_*>_>)._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var18 != (_List_node_base *)plVar1) {
    do {
      pCVar5 = (Character *)p_Var18[1]._M_next;
      if ((pCVar5 != from) && (bVar12 = Character::InRange(from,pCVar5), bVar12)) {
        Character::Send(pCVar5,(PacketBuilder *)local_1f0);
      }
      p_Var18 = p_Var18->_M_next;
    } while (p_Var18 != (_List_node_base *)plVar1);
  }
  PacketBuilder::Reset
            ((PacketBuilder *)local_1f0,
             ((long)local_c8.
                    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_c8.
                    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 9 + 2);
  PacketBuilder::SetID((PacketBuilder *)local_1f0,PACKET_WALK,PACKET_REPLY);
  PacketBuilder::AddByte((PacketBuilder *)local_1f0,0xff);
  PacketBuilder::AddByte((PacketBuilder *)local_1f0,0xff);
  psVar9 = local_c8.
           super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_c8.
      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_c8.
      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar23 = local_c8.
              super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar6 = (psVar23->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (psVar23->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,(int)peVar6->uid);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,(int)peVar6->id);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)peVar6->x);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)peVar6->y);
      PacketBuilder::AddThree((PacketBuilder *)local_1f0,peVar6->amount);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar23 = psVar23 + 1;
    } while (psVar23 != psVar9);
  }
  Character::Send(from,(PacketBuilder *)local_1f0);
  PacketBuilder::SetID((PacketBuilder *)local_1f0,PACKET_RANGE,PACKET_REPLY);
  uVar8 = local_158._8_8_;
  uVar24 = local_178._M_allocated_capacity;
  uVar27 = local_178._8_8_;
  if (local_158._M_allocated_capacity != local_158._8_8_) {
    uVar30 = local_158._M_allocated_capacity;
    do {
      pNVar7 = *(NPC **)uVar30;
      PacketBuilder::Reset((PacketBuilder *)local_1f0,8);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,0xff);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)pNVar7->index);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pNVar7->id);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)pNVar7->x);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)pNVar7->y);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)pNVar7->direction);
      Character::Send(from,(PacketBuilder *)local_1f0);
      uVar30 = uVar30 + 8;
      uVar24 = local_178._M_allocated_capacity;
      uVar27 = local_178._8_8_;
    } while (uVar30 != uVar8);
  }
  for (; uVar24 != uVar27; uVar24 = (NPC **)(uVar24 + 8)) {
    NPC::RemoveFromView(*(NPC **)uVar24,from);
  }
  Character::CheckQuestRules(from);
  bVar12 = false;
  if ((from->x < *(uchar *)(local_1e0._32_8_ + 0x18)) &&
     (bVar12 = false, from->y < *(uchar *)(local_1e0._32_8_ + 0x19))) {
    pMVar16 = GetTile((Map *)local_1e0._32_8_,from->x,from->y);
    bVar12 = (uint)(pMVar16->tilespec + ~Spikes1) < 2;
  }
  pWVar3 = *(World **)local_1e0._32_8_;
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"SpikeDamage","");
  pmVar15 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar3->config,(key_type *)local_f8);
  dVar32 = util::variant::GetFloat(pmVar15);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  WVar14 = WalkOK;
  if (((bVar12 && 0.0 < dVar32) && ((from->hidden & 1) == 0)) &&
     (Character::SpikeDamage(from,(int)(dVar32 * (double)from->maxhp)), from->hp == 0)) {
    WVar14 = WalkWarped;
    Character::DeathRespawn(from);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_1f0);
  std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
            (&local_c8);
  if ((NPC **)local_178._M_allocated_capacity != (NPC **)0x0) {
    operator_delete((void *)local_178._M_allocated_capacity,(long)local_168._M_p - local_178._0_8_);
  }
  if ((NPC **)local_158._M_allocated_capacity != (NPC **)0x0) {
    operator_delete((void *)local_158._M_allocated_capacity,(long)local_148._M_p - local_158._0_8_);
  }
  if ((Character **)local_138._0_8_ != (Character **)0x0) {
    operator_delete((void *)local_138._0_8_,(long)local_128 - local_138._0_8_);
  }
  if (local_118 != (Character **)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  if ((void *)local_1e0._40_8_ != (void *)0x0) {
    operator_delete((void *)local_1e0._40_8_,local_1e0._56_8_ - local_1e0._40_8_);
  }
  if ((void *)local_1e0._72_8_ != (void *)0x0) {
    operator_delete((void *)local_1e0._72_8_,local_1e0._88_8_ - local_1e0._72_8_);
  }
  return WVar14;
}

Assistant:

Map::WalkResult Map::Walk(Character *from, Direction direction, bool admin)
{
	int seedistance = this->world->config["SeeDistance"];

	unsigned char target_x = from->x;
	unsigned char target_y = from->y;

	switch (direction)
	{
		case DIRECTION_UP:
			target_y -= 1;

			if (target_y > from->y)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_RIGHT:
			target_x += 1;

			if (target_x < from->x)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_DOWN:
			target_y += 1;

			if (target_x < from->x)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_LEFT:
			target_x -= 1;

			if (target_x > from->x)
			{
				return WalkFail;
			}

			break;
	}

	if (!this->InBounds(target_x, target_y))
		return WalkFail;

	if (!admin)
	{
		if (!this->Walkable(target_x, target_y))
			return WalkFail;

		if (this->Occupied(target_x, target_y, PlayerOnly) && (from->last_walk + double(this->world->config["GhostTimer"]) > Timer::GetTime()))
			return WalkFail;
	}

	const Map_Warp& warp = this->GetWarp(target_x, target_y);

	if (warp)
	{
		if (from->level >= warp.levelreq && (warp.spec == Map_Warp::NoDoor || warp.open))
		{
			Map* map = this->world->GetMap(warp.map);
			if (from->SourceAccess() < ADMIN_GUIDE && map->evacuate_lock && map->id != from->map->id)
			{
				from->StatusMsg(this->world->i18n.Format("map_evacuate_block"));
				from->Refresh();
			}
			else
			{
				from->Warp(warp.map, warp.x, warp.y);
			}

			return WalkWarped;
		}

		if (!admin)
			return WalkFail;
	}

    from->last_walk = Timer::GetTime();
    from->attacks = 0;
    from->CancelSpell();

	from->direction = direction;

	from->x = target_x;
	from->y = target_y;

	int newx;
	int newy;
	int oldx;
	int oldy;

	std::vector<std::pair<int, int>> newcoords;
	std::vector<std::pair<int, int>> oldcoords;

	std::vector<Character *> newchars;
	std::vector<Character *> oldchars;
	std::vector<NPC *> newnpcs;
	std::vector<NPC *> oldnpcs;
	std::vector<std::shared_ptr<Map_Item>> newitems;

	switch (direction)
	{
		case DIRECTION_UP:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newy = from->y - seedistance + std::abs(i);
				newx = from->x + i;
				oldy = from->y + seedistance + 1 - std::abs(i);
				oldx = from->x + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_RIGHT:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newx = from->x + seedistance - std::abs(i);
				newy = from->y + i;
				oldx = from->x - seedistance - 1 + std::abs(i);
				oldy = from->y + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_DOWN:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newy = from->y + seedistance - std::abs(i);
				newx = from->x + i;
				oldy = from->y - seedistance - 1 + std::abs(i);
				oldx = from->x + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_LEFT:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newx = from->x - seedistance + std::abs(i);
				newy = from->y + i;
				oldx = from->x + seedistance + 1 - std::abs(i);
				oldy = from->y + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

	}

	UTIL_FOREACH(this->characters, checkchar)
	{
		if (checkchar == from)
		{
			continue;
		}

		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checkchar->x == oldcoords[i].first && checkchar->y == oldcoords[i].second)
			{
				oldchars.push_back(checkchar);
			}
			else if (checkchar->x == newcoords[i].first && checkchar->y == newcoords[i].second)
			{
				newchars.push_back(checkchar);
			}
		}
	}

	UTIL_FOREACH(this->npcs, checknpc)
	{
		if (!checknpc->alive)
		{
			continue;
		}

		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checknpc->x == oldcoords[i].first && checknpc->y == oldcoords[i].second)
			{
				oldnpcs.push_back(checknpc);
			}
			else if (checknpc->x == newcoords[i].first && checknpc->y == newcoords[i].second)
			{
				newnpcs.push_back(checknpc);
			}
		}
	}

	UTIL_FOREACH(this->items, checkitem)
	{
		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checkitem->x == newcoords[i].first && checkitem->y == newcoords[i].second)
			{
				newitems.push_back(checkitem);
			}
		}
	}

	PacketBuilder builder(PACKET_AVATAR, PACKET_REMOVE, 2);
	builder.AddShort(from->PlayerID());

	UTIL_FOREACH(oldchars, character)
	{
		PacketBuilder rbuilder(PACKET_AVATAR, PACKET_REMOVE, 2);
		rbuilder.AddShort(character->PlayerID());

		character->Send(builder);
		from->Send(rbuilder);
	}

	builder.Reset(62);
	builder.SetID(PACKET_PLAYERS, PACKET_AGREE);

	builder.AddByte(255);
	builder.AddBreakString(from->SourceName());
	builder.AddShort(from->PlayerID());
	builder.AddShort(from->mapid);
	builder.AddShort(from->x);
	builder.AddShort(from->y);
	builder.AddChar(from->direction);
	builder.AddChar(6); // ?
	builder.AddString(from->PaddedGuildTag());
	builder.AddChar(from->level);
	builder.AddChar(from->gender);
	builder.AddChar(from->hairstyle);
	builder.AddChar(from->haircolor);
	builder.AddChar(from->race);
	builder.AddShort(from->maxhp);
	builder.AddShort(from->hp);
	builder.AddShort(from->maxtp);
	builder.AddShort(from->tp);
	// equipment
	from->AddPaperdollData(builder, "B000A0HSW");
	builder.AddChar(from->sitting);
	builder.AddChar(from->IsHideInvisible());
	builder.AddByte(255);
	builder.AddChar(1); // 0 = NPC, 1 = player

	UTIL_FOREACH(newchars, character)
	{
		PacketBuilder rbuilder(PACKET_PLAYERS, PACKET_AGREE, 62);
		rbuilder.AddByte(255);
		rbuilder.AddBreakString(character->SourceName());
		rbuilder.AddShort(character->PlayerID());
		rbuilder.AddShort(character->mapid);
		rbuilder.AddShort(character->x);
		rbuilder.AddShort(character->y);
		rbuilder.AddChar(character->direction);
		rbuilder.AddChar(6); // ?
		rbuilder.AddString(character->PaddedGuildTag());
		rbuilder.AddChar(character->level);
		rbuilder.AddChar(character->gender);
		rbuilder.AddChar(character->hairstyle);
		rbuilder.AddChar(character->haircolor);
		rbuilder.AddChar(character->race);
		rbuilder.AddShort(character->maxhp);
		rbuilder.AddShort(character->hp);
		rbuilder.AddShort(character->maxtp);
		rbuilder.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(rbuilder, "B000A0HSW");

		rbuilder.AddChar(character->sitting);
		rbuilder.AddChar(character->IsHideInvisible());
		rbuilder.AddByte(255);
		rbuilder.AddChar(1); // 0 = NPC, 1 = player

		character->Send(builder);
		from->Send(rbuilder);
	}

	builder.Reset(5);
	builder.SetID(PACKET_WALK, PACKET_PLAYER);

	builder.AddShort(from->PlayerID());
	builder.AddChar(direction);
	builder.AddChar(from->x);
	builder.AddChar(from->y);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}

	builder.Reset(2 + newitems.size() * 9);
	builder.SetID(PACKET_WALK, PACKET_REPLY);

	builder.AddByte(255);
	builder.AddByte(255);
	UTIL_FOREACH(newitems, item)
	{
		builder.AddShort(item->uid);
		builder.AddShort(item->id);
		builder.AddChar(item->x);
		builder.AddChar(item->y);
		builder.AddThree(item->amount);
	}
	from->Send(builder);

	builder.SetID(PACKET_RANGE, PACKET_REPLY);
	UTIL_FOREACH(newnpcs, npc)
	{
		builder.Reset(8);
		builder.AddChar(0);
		builder.AddByte(255);
		builder.AddChar(npc->index);
		builder.AddShort(npc->id);
		builder.AddChar(npc->x);
		builder.AddChar(npc->y);
		builder.AddChar(npc->direction);

		from->Send(builder);
	}

	UTIL_FOREACH(oldnpcs, npc)
	{
		npc->RemoveFromView(from);
	}

	from->CheckQuestRules();

	Map_Tile::TileSpec spec = this->GetSpec(from->x, from->y);

	double spike_damage = this->world->config["SpikeDamage"];

	if (spike_damage > 0.0 && (spec == Map_Tile::Spikes2 || spec == Map_Tile::Spikes3) && !from->IsHideInvisible())
	{
		int amount = from->maxhp * spike_damage;

		from->SpikeDamage(amount);

		if (from->hp == 0)
		{
			from->DeathRespawn();
			return WalkWarped;
		}	
	}

	return WalkOK;
}